

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
          (ArraySpec *this,InputType inputType_,OutputType outputType_,Storage storage_,Usage usage_
          ,int componentCount_,int offset_,int stride_,bool normalize_,GLValue min_,GLValue max_)

{
  this->inputType = inputType_;
  this->outputType = outputType_;
  this->storage = storage_;
  this->usage = usage_;
  this->componentCount = componentCount_;
  this->offset = offset_;
  this->stride = stride_;
  this->normalize = normalize_;
  (this->min).type = min_.type;
  *(undefined4 *)&(this->min).field_0x4 = min_._4_4_;
  (this->min).field_1 = min_.field_1;
  (this->max).type = max_.type;
  *(undefined4 *)&(this->max).field_0x4 = max_._4_4_;
  (this->max).field_1 = max_.field_1;
  return;
}

Assistant:

MultiVertexArrayTest::Spec::ArraySpec::ArraySpec(Array::InputType inputType_, Array::OutputType outputType_, Array::Storage storage_, Array::Usage usage_, int componentCount_, int offset_, int stride_, bool normalize_, GLValue min_, GLValue max_)
	: inputType		(inputType_)
	, outputType	(outputType_)
	, storage		(storage_)
	, usage			(usage_)
	, componentCount(componentCount_)
	, offset		(offset_)
	, stride		(stride_)
	, normalize		(normalize_)
	, min			(min_)
	, max			(max_)
{
}